

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::RoundUp(Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  int *in_RDX;
  long in_FS_OFFSET;
  int i;
  int local_2c;
  Vector<char> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDX == 0) {
    pcVar2 = Vector<char>::operator[](&local_18,0);
    *pcVar2 = '1';
    *in_RCX = 1;
    *in_RDX = 1;
  }
  else {
    pcVar2 = Vector<char>::operator[](&local_18,*in_RDX + -1);
    *pcVar2 = *pcVar2 + '\x01';
    iVar1 = *in_RDX;
    while (local_2c = iVar1 + -1, 0 < local_2c) {
      pcVar2 = Vector<char>::operator[](&local_18,local_2c);
      if (*pcVar2 != ':') goto LAB_00705de6;
      pcVar2 = Vector<char>::operator[](&local_18,local_2c);
      *pcVar2 = '0';
      pcVar2 = Vector<char>::operator[](&local_18,iVar1 + -2);
      *pcVar2 = *pcVar2 + '\x01';
      iVar1 = local_2c;
    }
    pcVar2 = Vector<char>::operator[](&local_18,0);
    if (*pcVar2 == ':') {
      pcVar2 = Vector<char>::operator[](&local_18,0);
      *pcVar2 = '1';
      *in_RCX = *in_RCX + 1;
    }
  }
LAB_00705de6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}